

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::LookupLinkItems
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,cmListFileBacktrace *bt,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items)

{
  pointer pbVar1;
  __type _Var2;
  string *__rhs;
  pointer item;
  string name;
  string local_88;
  cmLinkItem local_68;
  
  pbVar1 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (item = (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; item != pbVar1; item = item + 1) {
    CheckCMP0004(&local_88,this,item);
    __rhs = GetName_abi_cxx11_(this);
    _Var2 = std::operator==(&local_88,__rhs);
    if ((!_Var2) && (local_88._M_string_length != 0)) {
      ResolveLinkItem(&local_68,this,&local_88,bt);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                (items,&local_68);
      cmLinkItem::~cmLinkItem(&local_68);
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void cmGeneratorTarget::LookupLinkItems(std::vector<std::string> const& names,
                                        cmListFileBacktrace const& bt,
                                        std::vector<cmLinkItem>& items) const
{
  for (std::string const& n : names) {
    std::string name = this->CheckCMP0004(n);
    if (name == this->GetName() || name.empty()) {
      continue;
    }
    items.push_back(this->ResolveLinkItem(name, bt));
  }
}